

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O3

void printTessCacheStats(void)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\"SHARED TESSELLATION CACHE\"",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SHARED TESSELLATION CACHE",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  embree::SharedTessellationCacheStats::printStats();
  LOCK();
  embree::SharedTessellationCacheStats::cache_accesses = 0;
  UNLOCK();
  LOCK();
  embree::SharedTessellationCacheStats::cache_hits = 0;
  UNLOCK();
  LOCK();
  embree::SharedTessellationCacheStats::cache_misses = 0;
  UNLOCK();
  LOCK();
  embree::SharedTessellationCacheStats::cache_flushes = 0;
  UNLOCK();
  return;
}

Assistant:

void printTessCacheStats()
{
  PRINT("SHARED TESSELLATION CACHE");
  embree::SharedTessellationCacheStats::printStats();
  embree::SharedTessellationCacheStats::clearStats();
}